

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim2.c
# Opt level: O2

int Gia_ManSimSimulateEquiv(Gia_Man_t *pAig,Gia_ParSim_t *pPars)

{
  uint *pInfo;
  uint uVar1;
  abctime aVar2;
  abctime aVar3;
  Gia_Man_t *p;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  Gia_Obj_t *pGVar8;
  Abc_Cex_t *pAVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int i_2;
  int iVar15;
  int iVar16;
  uint uVar17;
  int level;
  Gia_Man_t *pGVar18;
  Gia_Man_t *pGVar19;
  int i_1;
  int i;
  uint uVar20;
  int local_58;
  long local_48;
  
  aVar2 = Abc_Clock();
  iVar15 = pPars->TimeLimit;
  if ((long)iVar15 == 0) {
    local_48 = 0;
  }
  else {
    aVar3 = Abc_Clock();
    local_48 = aVar3 + (long)iVar15 * 1000000;
  }
  if ((pAig->pReprs == (Gia_Rpr_t *)0x0) || (pAig->pNexts == (int *)0x0)) {
    __assert_fail("pAig->pReprs && pAig->pNexts",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                  ,0x285,"int Gia_ManSimSimulateEquiv(Gia_Man_t *, Gia_ParSim_t *)");
  }
  if (pAig->pCexSeq != (Abc_Cex_t *)0x0) {
    free(pAig->pCexSeq);
    pAig->pCexSeq = (Abc_Cex_t *)0x0;
  }
  p = (Gia_Man_t *)Gia_Sim2Create(pAig,pPars);
  Gia_ManResetRandom(pPars);
  pGVar19 = (Gia_Man_t *)p->pName;
  iVar15 = 0;
  while ((iVar15 < pGVar19->nRegs &&
         (pGVar4 = Gia_ManCi(pGVar19,(pGVar19->vCis->nSize - pGVar19->nRegs) + iVar15),
         pGVar4 != (Gia_Obj_t *)0x0))) {
    Gia_Sim2InfoZero((Gia_Sim2_t *)p,
                     (uint *)((long)p->nRegs * (long)(int)pGVar4->Value * 4 + *(long *)&p->nObjs));
    iVar15 = iVar15 + 1;
  }
  local_58 = 0;
  uVar12 = 0;
  do {
    iVar15 = (int)uVar12;
    if (pPars->nIters <= iVar15) {
LAB_005fcd3f:
      Gia_Sim2Delete((Gia_Sim2_t *)p);
      iVar15 = (int)p;
      if (pAig->pCexSeq == (Abc_Cex_t *)0x0) {
        Abc_Print(iVar15,"No bug detected after simulating %d frames with %d words.  ",uVar12,
                  (ulong)(uint)pPars->nWords);
      }
      aVar3 = Abc_Clock();
      Abc_Print(iVar15,"%s =","Time");
      Abc_Print(iVar15,"%9.2f sec\n",(double)(aVar3 - aVar2) / 1000000.0);
      return local_58;
    }
    if (pGVar19->pObjs->Value != 0) {
      __assert_fail("Gia_ObjValue(pObj) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                    ,0x119,"void Gia_Sim2SimulateRound(Gia_Sim2_t *)");
    }
    pInfo = *(uint **)&p->nObjs;
    pGVar18 = p;
    Gia_Sim2InfoZero((Gia_Sim2_t *)p,pInfo);
    iVar16 = 0;
    while ((iVar16 < pGVar19->vCis->nSize - pGVar19->nRegs &&
           (pGVar18 = pGVar19, pGVar4 = Gia_ManCi(pGVar19,iVar16), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar20 = p->nRegs;
      uVar17 = pGVar4->Value;
      for (uVar6 = (ulong)uVar20; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
        pGVar18 = (Gia_Man_t *)0x0;
        uVar1 = Gia_ManRandom(0);
        pInfo[(long)(int)(uVar17 * uVar20) + (uVar6 - 1)] = uVar1;
      }
      iVar16 = iVar16 + 1;
    }
    uVar20 = 0;
    while (((int)uVar20 < pGVar19->nObjs &&
           (pGVar18 = pGVar19, pGVar4 = Gia_ManObj(pGVar19,uVar20), pGVar4 != (Gia_Obj_t *)0x0))) {
      uVar6 = *(ulong *)pGVar4;
      uVar17 = (uint)uVar6;
      if ((~uVar17 & 0x1fffffff) != 0 && -1 < (int)uVar17) {
        if (pGVar4->Value != uVar20) {
          __assert_fail("Gia_ObjValue(pObj) == i",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSim2.c"
                        ,0x11f,"void Gia_Sim2SimulateRound(Gia_Sim2_t *)");
        }
        uVar1 = p->nRegs;
        uVar5 = (ulong)uVar1;
        uVar10 = uVar17 & 0x1fffffff;
        uVar13 = (uint)(uVar6 >> 0x20) & 0x1fffffff;
        if ((uVar17 >> 0x1d & 1) == 0) {
          if ((uVar6 >> 0x3d & 1) == 0) {
            uVar17 = (uVar20 - uVar10) * uVar1;
            lVar11 = (long)(int)uVar17;
            for (; pGVar18 = (Gia_Man_t *)(ulong)uVar17, 0 < (int)uVar5; uVar5 = uVar5 - 1) {
              uVar17 = pInfo[(long)(int)((uVar20 - uVar13) * uVar1) + (uVar5 - 1)] &
                       pInfo[lVar11 + (uVar5 - 1)];
              pInfo[(long)(int)(uVar1 * uVar20) + (uVar5 - 1)] = uVar17;
            }
          }
          else {
            uVar17 = (uVar20 - uVar10) * uVar1;
            lVar11 = (long)(int)uVar17;
            for (; pGVar18 = (Gia_Man_t *)(ulong)uVar17, 0 < (int)uVar5; uVar5 = uVar5 - 1) {
              uVar17 = ~pInfo[(long)(int)((uVar20 - uVar13) * uVar1) + (uVar5 - 1)] &
                       pInfo[lVar11 + (uVar5 - 1)];
              pInfo[(long)(int)(uVar1 * uVar20) + (uVar5 - 1)] = uVar17;
            }
          }
        }
        else if ((uVar6 >> 0x3d & 1) == 0) {
          uVar17 = (uVar20 - uVar10) * uVar1;
          lVar11 = (long)(int)uVar17;
          for (; pGVar18 = (Gia_Man_t *)(ulong)uVar17, 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            uVar17 = ~pInfo[lVar11 + (uVar5 - 1)] &
                     pInfo[(long)(int)((uVar20 - uVar13) * uVar1) + (uVar5 - 1)];
            pInfo[(long)(int)(uVar1 * uVar20) + (uVar5 - 1)] = uVar17;
          }
        }
        else {
          uVar17 = (uVar20 - uVar10) * uVar1;
          lVar11 = (long)(int)uVar17;
          for (; pGVar18 = (Gia_Man_t *)(ulong)uVar17, 0 < (int)uVar5; uVar5 = uVar5 - 1) {
            uVar17 = ~(pInfo[(long)(int)((uVar20 - uVar13) * uVar1) + (uVar5 - 1)] |
                      pInfo[lVar11 + (uVar5 - 1)]);
            pInfo[(long)(int)(uVar1 * uVar20) + (uVar5 - 1)] = uVar17;
          }
        }
      }
      uVar20 = uVar20 + 1;
    }
    for (iVar16 = 0; level = (int)pGVar18, iVar16 < pGVar19->vCos->nSize; iVar16 = iVar16 + 1) {
      pGVar18 = pGVar19;
      pGVar4 = Gia_ManCo(pGVar19,iVar16);
      level = (int)pGVar18;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar20 = p->nRegs;
      uVar6 = (ulong)uVar20;
      lVar11 = (long)(int)(uVar20 * pGVar4->Value);
      uVar17 = *(uint *)pGVar4 & 0x1fffffff;
      pGVar18 = (Gia_Man_t *)(ulong)uVar17;
      lVar14 = (long)(int)((pGVar4->Value - uVar17) * uVar20);
      if ((*(uint *)pGVar4 >> 0x1d & 1) == 0) {
        for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
          pInfo[lVar11 + (uVar6 - 1)] = pInfo[lVar14 + (uVar6 - 1)];
        }
      }
      else {
        for (; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
          pInfo[lVar11 + (uVar6 - 1)] = ~pInfo[lVar14 + (uVar6 - 1)];
        }
      }
    }
    if (pPars->fVerbose != 0) {
      Abc_Print(level,"Frame %4d out of %4d and timeout %3d sec. ",(ulong)(iVar15 + 1),
                (ulong)(uint)pPars->nIters,(ulong)(uint)pPars->TimeLimit);
      pGVar18 = pAig;
      if ((pAig->pReprs != (Gia_Rpr_t *)0x0) && (pAig->pNexts != (int *)0x0)) {
        uVar20 = Gia_ManEquivCountLitsAll(pAig);
        Abc_Print((int)pGVar18,"Lits = %4d. ",(ulong)uVar20);
      }
      iVar16 = (int)pGVar18;
      aVar3 = Abc_Clock();
      Abc_Print(iVar16,"Time = %7.2f sec\r",((double)aVar3 - (double)aVar2) / 1000000.0);
    }
    if (pPars->fCheckMiter != 0) {
      uVar20 = 0;
LAB_005fcb6c:
      if (((int)uVar20 < pGVar19->vCos->nSize - pGVar19->nRegs) &&
         (pGVar4 = Gia_ManCo(pGVar19,uVar20), pGVar4 != (Gia_Obj_t *)0x0)) {
        uVar17 = p->nRegs;
        puVar7 = pInfo + (int)(pGVar4->Value * uVar17);
        uVar6 = 0;
        if (0 < (int)uVar17) {
          uVar6 = (ulong)uVar17;
        }
        for (lVar11 = 0; uVar6 * 0x20 + lVar11 != 0; lVar11 = lVar11 + -0x20) {
          if (*puVar7 != 0) {
            uVar1 = 0;
            goto LAB_005fcbcf;
          }
          puVar7 = puVar7 + 1;
        }
        goto LAB_005fcbed;
      }
    }
    if ((pAig->pReprs != (Gia_Rpr_t *)0x0) && (pAig->pNexts != (int *)0x0)) {
      Gia_Sim2InfoRefineEquivs((Gia_Sim2_t *)p);
    }
    aVar3 = Abc_Clock();
    if (local_48 < aVar3) {
      uVar12 = (ulong)(iVar15 + 1);
      local_58 = 0;
      goto LAB_005fcd3f;
    }
    if (iVar15 < pPars->nIters + -1) {
      iVar16 = 0;
      while (((iVar16 < pGVar19->nRegs &&
              (pGVar4 = Gia_ManCo(pGVar19,(iVar16 - pGVar19->nRegs) + pGVar19->vCos->nSize),
              pGVar4 != (Gia_Obj_t *)0x0)) &&
             (pGVar8 = Gia_ManCi(pGVar19,(pGVar19->vCis->nSize + iVar16) - pGVar19->nRegs),
             pGVar8 != (Gia_Obj_t *)0x0))) {
        uVar20 = p->nRegs;
        uVar17 = pGVar8->Value;
        uVar1 = pGVar4->Value;
        for (uVar12 = (ulong)uVar20; 0 < (int)uVar12; uVar12 = uVar12 - 1) {
          pInfo[(long)(int)(uVar17 * uVar20) + (uVar12 - 1)] =
               pInfo[(long)(int)(uVar1 * uVar20) + (uVar12 - 1)];
        }
        iVar16 = iVar16 + 1;
      }
    }
    uVar12 = (ulong)(iVar15 + 1);
  } while( true );
LAB_005fcbcf:
  if (uVar1 == 0x20) goto LAB_005fcbe0;
  if ((*puVar7 >> (uVar1 & 0x1f) & 1) != 0) goto LAB_005fcbe4;
  uVar1 = uVar1 + 1;
  goto LAB_005fcbcf;
LAB_005fcbe0:
  uVar1 = 0xffffffff;
LAB_005fcbe4:
  if (-1 < (int)(uVar1 - (int)lVar11)) {
    Gia_ManResetRandom(pPars);
    pPars->iOutFail = uVar20;
    pGVar19 = pAig;
    pAVar9 = Gia_Sim2GenerateCounter(pAig,iVar15,uVar20,uVar17,uVar1 - (int)lVar11);
    pAig->pCexSeq = pAVar9;
    Abc_Print((int)pGVar19,"Output %d of miter \"%s\" was asserted in frame %d.  ",(ulong)uVar20,
              pAig->pName,uVar12);
    pGVar19 = pAig;
    iVar15 = Gia_ManVerifyCex(pAig,pAig->pCexSeq,0);
    local_58 = 1;
    if (iVar15 == 0) {
      Abc_Print((int)pGVar19,"\nGenerated counter-example is INVALID.                    ");
    }
    goto LAB_005fcd3f;
  }
LAB_005fcbed:
  uVar20 = uVar20 + 1;
  goto LAB_005fcb6c;
}

Assistant:

int Gia_ManSimSimulateEquiv( Gia_Man_t * pAig, Gia_ParSim_t * pPars )
{
    Gia_Sim2_t * p;
    Gia_Obj_t * pObj;
    abctime clkTotal = Abc_Clock();
    int i, RetValue = 0, iOut, iPat;
    abctime nTimeToStop = pPars->TimeLimit ? pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;
    assert( pAig->pReprs && pAig->pNexts );
    ABC_FREE( pAig->pCexSeq );
    p = Gia_Sim2Create( pAig, pPars );
    Gia_ManResetRandom( pPars );
    Gia_ManForEachRo( p->pAig, pObj, i )
        Gia_Sim2InfoZero( p, Gia_Sim2Data(p, Gia_ObjValue(pObj)) );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_Sim2SimulateRound( p );
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Frame %4d out of %4d and timeout %3d sec. ", i+1, pPars->nIters, pPars->TimeLimit );
            if ( pAig->pReprs && pAig->pNexts )
                Abc_Print( 1, "Lits = %4d. ", Gia_ManEquivCountLitsAll(pAig) );
            Abc_Print( 1, "Time = %7.2f sec\r", (1.0*Abc_Clock()-clkTotal)/CLOCKS_PER_SEC );
        }
        if ( pPars->fCheckMiter && Gia_Sim2CheckPos( p, &iOut, &iPat ) )
        {
            Gia_ManResetRandom( pPars );
            pPars->iOutFail = iOut;
            pAig->pCexSeq = Gia_Sim2GenerateCounter( pAig, i, iOut, p->nWords, iPat );
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", iOut, pAig->pName, i );
            if ( !Gia_ManVerifyCex( pAig, pAig->pCexSeq, 0 ) )
            {
//                Abc_Print( 1, "\n" );
                Abc_Print( 1, "\nGenerated counter-example is INVALID.                    " );
//                Abc_Print( 1, "\n" );
            }
            else
            {
//                Abc_Print( 1, "\n" );
//                if ( pPars->fVerbose )
//                Abc_Print( 1, "\nGenerated counter-example is verified correctly.         " );
//                Abc_Print( 1, "\n" );
            }
            RetValue = 1;
            break;
        }
        if ( pAig->pReprs && pAig->pNexts )
            Gia_Sim2InfoRefineEquivs( p );
        if ( Abc_Clock() > nTimeToStop )
        {
            i++;
            break;
        }
        if ( i < pPars->nIters - 1 )
            Gia_Sim2InfoTransfer( p );
    }
    Gia_Sim2Delete( p );
    if ( pAig->pCexSeq == NULL )
        Abc_Print( 1, "No bug detected after simulating %d frames with %d words.  ", i, pPars->nWords );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    return RetValue;
}